

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::BufferSupport::initPrograms
          (BufferSupport *this,SourceCollections *programCollection)

{
  undefined8 programCollection_00;
  int iVar1;
  char *__s;
  ostream *poVar2;
  string local_380;
  string local_360;
  ostringstream local_340 [8];
  ostringstream copySrc;
  ostringstream local_1c8 [8];
  ostringstream declSrc;
  int numVecElements;
  allocator<char> local_39;
  string local_38 [8];
  string bufferTypeStr;
  SourceCollections *programCollection_local;
  BufferSupport *this_local;
  
  __s = "buffer";
  if (this->m_bufferType == BUFFER_TYPE_UNIFORM) {
    __s = "uniform";
  }
  bufferTypeStr.field_2._8_8_ = programCollection;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  iVar1 = tcu::Vector<int,_4>::x(&(this->m_resourceDesc).size);
  iVar1 = (int)((ulong)(long)iVar1 >> 4);
  std::__cxx11::ostringstream::ostringstream(local_1c8);
  poVar2 = std::operator<<((ostream *)local_1c8,"layout(set = 0, binding = 0, std140) readonly ");
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2," Input {\n");
  poVar2 = std::operator<<(poVar2,"    uvec4 data[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"];\n");
  poVar2 = std::operator<<(poVar2,"} b_in;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 1, std140) writeonly buffer Output {\n"
                          );
  poVar2 = std::operator<<(poVar2,"    uvec4 data[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"];\n");
  std::operator<<(poVar2,"} b_out;\n");
  std::__cxx11::ostringstream::ostringstream(local_340);
  poVar2 = std::operator<<((ostream *)local_340,"    for (int i = 0; i < ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"; ++i) {\n");
  poVar2 = std::operator<<(poVar2,"        b_out.data[i] = b_in.data[i];\n");
  std::operator<<(poVar2,"    }\n");
  programCollection_00 = bufferTypeStr.field_2._8_8_;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  initPassthroughPrograms
            ((SourceCollections *)programCollection_00,&this->m_shaderPrefix,&local_360,&local_380,
             this->m_stage);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::ostringstream::~ostringstream(local_340);
  std::__cxx11::ostringstream::~ostringstream(local_1c8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection) const
	{
		DE_ASSERT((m_resourceDesc.size.x() % sizeof(tcu::UVec4)) == 0);

		const std::string	bufferTypeStr	= (m_bufferType == BUFFER_TYPE_UNIFORM ? "uniform" : "buffer");
		const int			numVecElements	= static_cast<int>(m_resourceDesc.size.x() / sizeof(tcu::UVec4));  // std140 must be aligned to a multiple of 16

		std::ostringstream declSrc;
		declSrc << "layout(set = 0, binding = 0, std140) readonly " << bufferTypeStr << " Input {\n"
				<< "    uvec4 data[" << numVecElements << "];\n"
				<< "} b_in;\n"
				<< "\n"
				<< "layout(set = 0, binding = 1, std140) writeonly buffer Output {\n"
				<< "    uvec4 data[" << numVecElements << "];\n"
				<< "} b_out;\n";

		std::ostringstream copySrc;
		copySrc << "    for (int i = 0; i < " << numVecElements << "; ++i) {\n"
				<< "        b_out.data[i] = b_in.data[i];\n"
				<< "    }\n";

		initPassthroughPrograms(programCollection, m_shaderPrefix, declSrc.str(), copySrc.str(), m_stage);
	}